

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unowned_ptr.cpp
# Opt level: O1

void __thiscall Unowned_Assign_Test::TestBody(Unowned_Assign_Test *this)

{
  bool bVar1;
  char *pcVar2;
  unowned_ptr<int> b;
  AssertionResult gtest_ar;
  unowned_ptr<int> a;
  int i;
  AssertHelper local_48;
  unowned_ptr<int> local_40;
  internal local_38 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertHelper local_28;
  unowned_ptr<int> local_20;
  Type local_14;
  
  local_14 = 5;
  local_40._p = (int *)&stack0xffffffffffffffec;
  local_20._p = (int *)&stack0xffffffffffffffec;
  testing::internal::CmpHelperEQ<cgs::unowned_ptr<int>,int*>
            (local_38,"a","&i",&local_20,&local_40._p);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x2b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((AssertHelperData *)local_40._p != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((AssertHelperData *)local_40._p != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_40._p + 8))();
      }
      local_40._p = (int *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_20._p = (int *)0x0;
  local_40._p = (int *)0x0;
  testing::internal::CmpHelperEQ<cgs::unowned_ptr<int>,decltype(nullptr)>
            (local_38,"a","nullptr",&local_20,&local_40._p);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x2d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((long *)local_40._p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_40._p != (long *)0x0)) {
        (**(code **)(*(long *)local_40._p + 8))();
      }
      local_40._p = (int *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_20._p = (int *)0x0;
  local_40._p = (int *)0x0;
  testing::internal::CmpHelperEQ<cgs::unowned_ptr<int>,decltype(nullptr)>
            (local_38,"a","nullptr",&local_20,&local_40._p);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x2f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((long *)local_40._p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_40._p != (long *)0x0)) {
        (**(code **)(*(long *)local_40._p + 8))();
      }
      local_40._p = (int *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.data_ = (AssertHelperData *)&stack0xffffffffffffffec;
  local_40._p = (int *)&stack0xffffffffffffffec;
  local_20._p = (int *)&stack0xffffffffffffffec;
  testing::internal::CmpHelperEQ<cgs::unowned_ptr<int>,int*>
            (local_38,"a","&i",&local_20,(int **)&local_48);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x32,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_48.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_48.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_48.data_ + 8))();
      }
      local_48.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperEQ<cgs::unowned_ptr<int>,cgs::unowned_ptr<int>>
            (local_38,"a","b",&local_20,&local_40);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x33,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_48.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_48.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_48.data_ + 8))();
      }
      local_48.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(Unowned, Assign)
{
    int i = 5;
    unowned_ptr<int> a { &i };
    EXPECT_EQ(a, &i);
    a = nullptr;
    EXPECT_EQ(a, nullptr);
    a = {};
    EXPECT_EQ(a, nullptr);
    unowned_ptr<int> b { &i };
    a = b;
    EXPECT_EQ(a, &i);
    EXPECT_EQ(a, b);

}